

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve.c
# Opt level: O2

void av1_convolve_x_sr_c(uint8_t *src,int src_stride,uint8_t *dst,int dst_stride,int w,int h,
                        InterpFilterParams *filter_params_x,int subpel_x_qn,
                        ConvolveParams *conv_params)

{
  byte bVar1;
  ushort uVar2;
  int16_t *piVar3;
  byte bVar4;
  ulong uVar5;
  int k;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  uint8_t uVar11;
  int iVar12;
  int iVar13;
  
  uVar2 = filter_params_x->taps;
  bVar4 = 7 - (char)conv_params->round_0;
  piVar3 = filter_params_x->filter_ptr;
  uVar8 = (ulong)(uint)w;
  if (w < 1) {
    uVar8 = 0;
  }
  uVar9 = (ulong)(uint)h;
  if (h < 1) {
    uVar9 = 0;
  }
  iVar12 = 1 - (uint)(uVar2 >> 1);
  for (uVar5 = 0; uVar5 != uVar9; uVar5 = uVar5 + 1) {
    iVar13 = iVar12;
    for (uVar10 = 0; uVar10 != uVar8; uVar10 = uVar10 + 1) {
      iVar7 = 0;
      for (uVar6 = 0; filter_params_x->taps != uVar6; uVar6 = uVar6 + 1) {
        iVar7 = iVar7 + (uint)src[uVar6 + (long)iVar13] *
                        (int)*(short *)((long)piVar3 +
                                       uVar6 * 2 + (ulong)((subpel_x_qn & 0xfU) * (uint)uVar2 * 2));
      }
      bVar1 = (byte)conv_params->round_0;
      iVar7 = (((1 << (bVar1 & 0x1f)) >> 1) + iVar7 >> (bVar1 & 0x1f)) +
              ((1 << (bVar4 & 0x1f)) >> 1) >> (bVar4 & 0x1f);
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      uVar11 = (uint8_t)iVar7;
      if (0xfe < iVar7) {
        uVar11 = 0xff;
      }
      dst[uVar10 + uVar5 * (long)dst_stride] = uVar11;
      iVar13 = iVar13 + 1;
    }
    iVar12 = iVar12 + src_stride;
  }
  return;
}

Assistant:

void av1_convolve_x_sr_c(const uint8_t *src, int src_stride, uint8_t *dst,
                         int dst_stride, int w, int h,
                         const InterpFilterParams *filter_params_x,
                         const int subpel_x_qn, ConvolveParams *conv_params) {
  const int fo_horiz = filter_params_x->taps / 2 - 1;
  const int bits = FILTER_BITS - conv_params->round_0;

  assert(bits >= 0);
  assert((FILTER_BITS - conv_params->round_1) >= 0 ||
         ((conv_params->round_0 + conv_params->round_1) == 2 * FILTER_BITS));

  // horizontal filter
  const int16_t *x_filter = av1_get_interp_filter_subpel_kernel(
      filter_params_x, subpel_x_qn & SUBPEL_MASK);

  for (int y = 0; y < h; ++y) {
    for (int x = 0; x < w; ++x) {
      int32_t res = 0;
      for (int k = 0; k < filter_params_x->taps; ++k) {
        res += x_filter[k] * src[y * src_stride + x - fo_horiz + k];
      }
      res = ROUND_POWER_OF_TWO(res, conv_params->round_0);
      dst[y * dst_stride + x] = clip_pixel(ROUND_POWER_OF_TWO(res, bits));
    }
  }
}